

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_6::SetStringVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  long lVar1;
  Descriptor *descriptor_00;
  mapped_type *pmVar2;
  Options *in_RCX;
  AlphaNum *a;
  FieldDescriptor *field;
  string *this;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string default_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  key_type local_b8;
  key_type local_98;
  key_type local_78;
  key_type local_58;
  allocator local_32;
  allocator local_31;
  
  SetCommonFieldVariables(descriptor,variables,options);
  DefaultValue_abi_cxx11_
            ((string *)local_108,(cpp *)options,(Options *)descriptor,(FieldDescriptor *)in_RCX);
  std::__cxx11::string::string((string *)&local_58,"default",(allocator *)&local_98);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_58);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)local_108);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_108);
  strings::AlphaNum::AlphaNum
            ((AlphaNum *)local_108,*(unsigned_long *)(*(long *)(descriptor + 0x90) + 8));
  StrCat_abi_cxx11_(&local_58,(protobuf *)local_108,a);
  std::__cxx11::string::string((string *)&local_98,"default_length",(allocator *)&local_d8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_98);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  MakeDefaultName_abi_cxx11_((string *)local_108,(cpp *)descriptor,field);
  std::__cxx11::string::string((string *)&local_58,"default_variable_name",(allocator *)&local_98);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_58);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_58);
  lVar1 = *(long *)(*(long *)(descriptor + 0x90) + 8);
  if (lVar1 == 0) {
    std::__cxx11::string::string((string *)&local_d8,"proto_ns",(allocator *)&local_128);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_d8);
    std::operator+(&local_98,"&::",pmVar2);
    std::operator+(&local_58,&local_98,"::internal::GetEmptyStringAlreadyInited()");
  }
  else {
    QualifiedClassName_abi_cxx11_
              (&local_148,*(cpp **)(descriptor + 0x50),(Descriptor *)options,in_RCX);
    std::operator+(&local_128,"&",&local_148);
    std::operator+(&local_d8,&local_128,"::");
    std::operator+(&local_98,&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    std::operator+(&local_58,&local_98,".get()");
  }
  std::__cxx11::string::string((string *)&local_78,"default_variable",(allocator *)&local_b8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if (lVar1 == 0) {
    std::__cxx11::string::~string((string *)&local_98);
    this = &local_d8;
  }
  else {
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_128);
    this = &local_148;
  }
  std::__cxx11::string::~string((string *)this);
  FieldDescriptor::type(descriptor);
  std::__cxx11::string::string((string *)&local_58,"pointer_type",(allocator *)&local_78);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_58);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_78,"DCHK",&local_32);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::operator+(&local_58,pmVar2,"(value != nullptr);\n");
  std::__cxx11::string::string((string *)&local_b8,"null_check",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  descriptor_00 = *(Descriptor **)(descriptor + 0x50);
  std::__cxx11::string::string((string *)&local_78,"release_",&local_32);
  SafeFunctionName(&local_58,descriptor_00,descriptor,&local_78);
  std::__cxx11::string::string((string *)&local_b8,"release_name",&local_31);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_58,"full_name",(allocator *)&local_78);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_58);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_58);
  if (options->opensource_runtime == true) {
    std::__cxx11::string::string((string *)&local_58,"string_piece",(allocator *)&local_78);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_58);
    std::__cxx11::string::assign((char *)pmVar2);
  }
  else {
    std::__cxx11::string::string((string *)&local_58,"string_piece",(allocator *)&local_78);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_58);
    std::__cxx11::string::assign((char *)pmVar2);
  }
  std::__cxx11::string::~string((string *)&local_58);
  HasDescriptorMethods(*(FileDescriptor **)(descriptor + 0x28),options);
  std::__cxx11::string::string((string *)&local_58,"lite",(allocator *)&local_78);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_58);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_108);
  return;
}

Assistant:

void SetStringVariables(const FieldDescriptor* descriptor,
                        std::map<std::string, std::string>* variables,
                        const Options& options) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["default"] = DefaultValue(options, descriptor);
  (*variables)["default_length"] =
      StrCat(descriptor->default_value_string().length());
  std::string default_variable_string = MakeDefaultName(descriptor);
  (*variables)["default_variable_name"] = default_variable_string;
  (*variables)["default_variable"] =
      descriptor->default_value_string().empty()
          ? "&::" + (*variables)["proto_ns"] +
                "::internal::GetEmptyStringAlreadyInited()"
          : "&" + QualifiedClassName(descriptor->containing_type(), options) +
                "::" + default_variable_string + ".get()";
  (*variables)["pointer_type"] =
      descriptor->type() == FieldDescriptor::TYPE_BYTES ? "void" : "char";
  (*variables)["null_check"] = (*variables)["DCHK"] + "(value != nullptr);\n";
  // NOTE: Escaped here to unblock proto1->proto2 migration.
  // TODO(liujisi): Extend this to apply for other conflicting methods.
  (*variables)["release_name"] =
      SafeFunctionName(descriptor->containing_type(), descriptor, "release_");
  (*variables)["full_name"] = descriptor->full_name();

  if (options.opensource_runtime) {
    (*variables)["string_piece"] = "::std::string";
  } else {
    (*variables)["string_piece"] = "::StringPiece";
  }

  (*variables)["lite"] =
      HasDescriptorMethods(descriptor->file(), options) ? "" : "Lite";
}